

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_queue.cpp
# Opt level: O1

ssize_t __thiscall mpt::io::queue::read(queue *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  undefined4 in_register_00000034;
  long lVar2;
  long lVar3;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  if (lVar2 != 0) {
    lVar3 = 0;
    do {
      lVar1 = mpt_qpop(&this->_d,__nbytes,__buf);
      if (lVar1 == 0) {
        return lVar3;
      }
      lVar3 = lVar3 + 1;
      __buf = (void *)((long)__buf + __nbytes);
    } while (lVar2 != lVar3);
  }
  return lVar2;
}

Assistant:

ssize_t io::queue::read(size_t len, void *d, size_t part)
{
	size_t done = 0;
	while (done < len) {
		if (!mpt_qpop(&_d, part, d)) {
			return done;
		}
		++done;
		d = ((char *) d) + part;
	}
	return len;
}